

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomLayoutItem::write(DomLayoutItem *this,int __fd,void *__buf,size_t __n)

{
  Kind KVar1;
  QArrayData *pQVar2;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QString local_40;
  long local_28;
  
  aVar3._4_4_ = in_register_00000034;
  aVar3._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"layoutitem";
    local_40.d.size = 10;
  }
  else {
    QString::toLower_helper(&local_40);
  }
  QVar10.m_size = (size_t)local_40.d.ptr;
  QVar10.field_0.m_data = aVar3.m_data;
  QXmlStreamWriter::writeStartElement(QVar10);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (this->m_has_attr_row == true) {
    QString::number((int)&local_40,this->m_attr_row);
    QVar4.m_size = (size_t)local_40.d.ptr;
    QVar4.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000003;
    QVar11.m_size = (size_t)L"row";
    QVar11.field_0.m_data = aVar3.m_data;
    __n = (size_t)local_40.d.ptr;
    QXmlStreamWriter::writeAttribute(QVar11,QVar4);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (this->m_has_attr_column == true) {
    QString::number((int)&local_40,this->m_attr_column);
    QVar5.m_size = (size_t)local_40.d.ptr;
    QVar5.field_0.m_data = (void *)0x8000000000000006;
    QVar12.m_size = (size_t)L"column";
    QVar12.field_0.m_data = aVar3.m_data;
    __n = (size_t)local_40.d.ptr;
    QXmlStreamWriter::writeAttribute(QVar12,QVar5);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (this->m_has_attr_rowSpan == true) {
    QString::number((int)&local_40,this->m_attr_rowSpan);
    QVar6.m_size = (size_t)local_40.d.ptr;
    QVar6.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
    QVar13.m_size = (size_t)L"rowspan";
    QVar13.field_0.m_data = aVar3.m_data;
    __n = (size_t)local_40.d.ptr;
    QXmlStreamWriter::writeAttribute(QVar13,QVar6);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (this->m_has_attr_colSpan == true) {
    QString::number((int)&local_40,this->m_attr_colSpan);
    QVar7.m_size = (size_t)local_40.d.ptr;
    QVar7.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
    QVar14.m_size = (size_t)L"colspan";
    QVar14.field_0.m_data = aVar3.m_data;
    __n = (size_t)local_40.d.ptr;
    QXmlStreamWriter::writeAttribute(QVar14,QVar7);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (this->m_has_attr_alignment == true) {
    pQVar2 = &((this->m_attr_alignment).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_alignment).d.ptr;
    if (pQVar2 == (QArrayData *)0x0) {
      QVar9.m_size = __n;
      QVar9.field_0.m_data = (void *)0x8000000000000009;
      QVar16.m_size = (size_t)L"alignment";
      QVar16.field_0.m_data = aVar3.m_data;
      QXmlStreamWriter::writeAttribute(QVar16,QVar9);
    }
    else {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar8.m_size = __n;
      QVar8.field_0.m_data = (void *)0x8000000000000009;
      QVar15.m_size = (size_t)L"alignment";
      QVar15.field_0.m_data = aVar3.m_data;
      QXmlStreamWriter::writeAttribute(QVar15,QVar8);
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
  }
  KVar1 = this->m_kind;
  if (KVar1 == Spacer) {
    if (this->m_spacer == (DomSpacer *)0x0) goto LAB_0016099b;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"spacer";
    local_40.d.size = 6;
    DomSpacer::write(this->m_spacer,__fd,&local_40,__n);
  }
  else if (KVar1 == Layout) {
    if (this->m_layout == (DomLayout *)0x0) goto LAB_0016099b;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"layout";
    local_40.d.size = 6;
    DomLayout::write(this->m_layout,__fd,&local_40,__n);
  }
  else {
    if ((KVar1 != Widget) || (this->m_widget == (DomWidget *)0x0)) goto LAB_0016099b;
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"widget";
    local_40.d.size = 6;
    DomWidget::write(this->m_widget,__fd,&local_40,__n);
  }
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0016099b:
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomLayoutItem::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("layoutitem") : tagName.toLower());

    if (hasAttributeRow())
        writer.writeAttribute(u"row"_s, QString::number(attributeRow()));

    if (hasAttributeColumn())
        writer.writeAttribute(u"column"_s, QString::number(attributeColumn()));

    if (hasAttributeRowSpan())
        writer.writeAttribute(u"rowspan"_s, QString::number(attributeRowSpan()));

    if (hasAttributeColSpan())
        writer.writeAttribute(u"colspan"_s, QString::number(attributeColSpan()));

    if (hasAttributeAlignment())
        writer.writeAttribute(u"alignment"_s, attributeAlignment());

    switch (kind()) {
    case Widget:
        if (m_widget != nullptr)
            m_widget->write(writer, u"widget"_s);
        break;

    case Layout:
        if (m_layout != nullptr)
            m_layout->write(writer, u"layout"_s);
        break;

    case Spacer:
        if (m_spacer != nullptr)
            m_spacer->write(writer, u"spacer"_s);
        break;

    default:
        break;
    }
    writer.writeEndElement();
}